

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O2

CURLcode Curl_httpchunk_add_reader(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_creader *reader;
  
  reader = (Curl_creader *)0x0;
  CVar1 = Curl_creader_create(&reader,data,&Curl_httpchunk_encoder,CURL_CR_TRANSFER_ENCODE);
  if (CVar1 == CURLE_OK) {
    CVar1 = Curl_creader_add(data,reader);
  }
  if (reader != (Curl_creader *)0x0 && CVar1 != CURLE_OK) {
    Curl_creader_free(data,reader);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_httpchunk_add_reader(struct Curl_easy *data)
{
  struct Curl_creader *reader = NULL;
  CURLcode result;

  result = Curl_creader_create(&reader, data, &Curl_httpchunk_encoder,
                               CURL_CR_TRANSFER_ENCODE);
  if(!result)
    result = Curl_creader_add(data, reader);

  if(result && reader)
    Curl_creader_free(data, reader);
  return result;
}